

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

la_int64_t archive_write_disk_gid(archive *_a,char *name,la_int64_t id)

{
  undefined8 uVar1;
  int iVar2;
  wchar_t magic_test;
  archive_write_disk *a;
  la_int64_t id_local;
  char *name_local;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_gid");
  if (iVar2 == -0x1e) {
    _a_local = (archive *)0xffffffffffffffe2;
  }
  else {
    _a_local = (archive *)id;
    if (_a[1].error_string.buffer_length != 0) {
      uVar1._0_4_ = _a[1].current_codepage;
      uVar1._4_4_ = _a[1].current_oemcp;
      _a_local = (archive *)(*(code *)_a[1].error_string.buffer_length)(uVar1,name,id);
    }
  }
  return (la_int64_t)_a_local;
}

Assistant:

int64_t
archive_write_disk_gid(struct archive *_a, const char *name, la_int64_t id)
{
       struct archive_write_disk *a = (struct archive_write_disk *)_a;
       archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
           ARCHIVE_STATE_ANY, "archive_write_disk_gid");
       if (a->lookup_gid)
               return (a->lookup_gid)(a->lookup_gid_data, name, id);
       return (id);
}